

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  int line;
  char *text;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1acf,"=> write");
  if (ssl == (mbedtls_ssl_context *)0x0) {
    return -0x7100;
  }
  if (ssl->conf == (mbedtls_ssl_config *)0x0) {
    return -0x7100;
  }
  iVar2 = ssl_check_ctr_renegotiate(ssl);
  if (iVar2 == 0) {
    if ((ssl->state == 0x10) || (iVar2 = mbedtls_ssl_handshake(ssl), iVar2 == 0)) {
      if (((len < 2) ||
          ((((*(uint *)&ssl->conf->field_0x174 & 0x2000) == 0 || (1 < ssl->minor_ver)) ||
           (pmVar1 = (ssl->transform_out->cipher_ctx_enc).cipher_info,
           pmVar1 == (mbedtls_cipher_info_t *)0x0)))) || (pmVar1->mode != MBEDTLS_MODE_CBC)) {
        iVar2 = ssl_write_real(ssl,buf,len);
      }
      else {
        if (ssl->split_done == '\0') {
          iVar2 = ssl_write_real(ssl,buf,1);
          if (iVar2 < 1) goto LAB_0011d5ef;
          ssl->split_done = '\x01';
        }
        iVar2 = ssl_write_real(ssl,buf + 1,len - 1);
        if (0 < iVar2) {
          ssl->split_done = '\0';
          iVar2 = iVar2 + 1;
        }
      }
LAB_0011d5ef:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x1aeb,"<= write");
      return iVar2;
    }
    text = "mbedtls_ssl_handshake";
    line = 0x1ae0;
  }
  else {
    text = "ssl_check_ctr_renegotiate";
    line = 0x1ad7;
  }
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,line,text,iVar2);
  return iVar2;
}

Assistant:

int mbedtls_ssl_write( mbedtls_ssl_context *ssl, const unsigned char *buf, size_t len )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write" ) );

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ( ret = ssl_check_ctr_renegotiate( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "ssl_check_ctr_renegotiate", ret );
        return( ret );
    }
#endif

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_handshake( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_handshake", ret );
            return( ret );
        }
    }

#if defined(MBEDTLS_SSL_CBC_RECORD_SPLITTING)
    ret = ssl_write_split( ssl, buf, len );
#else
    ret = ssl_write_real( ssl, buf, len );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write" ) );

    return( ret );
}